

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ID.cpp
# Opt level: O3

void __thiscall ID_table_t::erase(ID_table_t *this,string *id_name)

{
  pointer pIVar1;
  pointer pcVar2;
  size_t __n;
  undefined1 *puVar3;
  int iVar4;
  Exception *this_00;
  pointer pIVar5;
  long lVar6;
  bool bVar7;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  pIVar5 = (this->table).super__Vector_base<ID,_std::allocator<ID>_>._M_impl.super__Vector_impl_data
           ._M_start;
  pIVar1 = (this->table).super__Vector_base<ID,_std::allocator<ID>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  if (pIVar5 != pIVar1) {
    lVar6 = -(long)pIVar5;
    do {
      pcVar2 = (pIVar5->name)._M_dataplus._M_p;
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,pcVar2 + (pIVar5->name)._M_string_length);
      puVar3 = local_50;
      __n = id_name->_M_string_length;
      if (__n == local_48) {
        if (__n == 0) {
          bVar7 = true;
        }
        else {
          iVar4 = bcmp((id_name->_M_dataplus)._M_p,local_50,__n);
          bVar7 = iVar4 == 0;
        }
      }
      else {
        bVar7 = false;
      }
      if (puVar3 != local_40) {
        operator_delete(puVar3);
      }
      if (bVar7) {
        std::vector<ID,_std::allocator<ID>_>::_M_erase(&this->table,(ID *)-lVar6);
        return;
      }
      pIVar5 = pIVar5 + 1;
      lVar6 = lVar6 + -0x30;
    } while (pIVar5 != pIVar1);
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x30);
  Exception::Exception(this_00,"Scanner error: identifier not found: ",id_name);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void ID_table_t::erase(const string& id_name){
    vector<ID>::iterator ptr = table.begin();
    vector<ID>::iterator end  = table.end();

    while(ptr != end){
        if(id_name == ptr->get_name()){
            table.erase(ptr);
            return;
        }
        ++ptr;
    }
    throw Exception("Scanner error: identifier not found: ", id_name);
}